

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ocsp.cc
# Opt level: O0

shared_ptr<const_bssl::ParsedCertificate> __thiscall
bssl::anon_unknown_18::OCSPParseCertificate(anon_unknown_18 *this,string_view der)

{
  uint8_t *data;
  size_type len;
  CRYPTO_BUFFER *__p;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<const_bssl::ParsedCertificate> sVar1;
  ParseCertificateOptions local_55 [13];
  unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> local_48;
  undefined1 local_40 [8];
  CertErrors errors;
  undefined1 auStack_20 [7];
  ParseCertificateOptions parse_options;
  string_view der_local;
  
  _auStack_20 = der._M_len;
  ParseCertificateOptions::ParseCertificateOptions
            ((ParseCertificateOptions *)
             ((long)&errors.nodes_.
                     super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  errors.nodes_.super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  CertErrors::CertErrors((CertErrors *)local_40);
  data = (uint8_t *)
         ::std::basic_string_view<char,_std::char_traits<char>_>::data
                   ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20);
  len = ::std::basic_string_view<char,_std::char_traits<char>_>::size
                  ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20);
  __p = CRYPTO_BUFFER_new(data,len,(CRYPTO_BUFFER_POOL *)0x0);
  ::std::unique_ptr<crypto_buffer_st,bssl::internal::Deleter>::
  unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<crypto_buffer_st,bssl::internal::Deleter> *)&local_48,__p);
  local_55[0].allow_invalid_serial_numbers = false;
  ParsedCertificate::Create
            ((ParsedCertificate *)this,(UniquePtr<CRYPTO_BUFFER> *)&local_48,local_55,
             (CertErrors *)local_40);
  ::std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr(&local_48);
  CertErrors::~CertErrors((CertErrors *)local_40);
  sVar1.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_bssl::ParsedCertificate>)
         sVar1.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<const ParsedCertificate> OCSPParseCertificate(
    std::string_view der) {
  ParseCertificateOptions parse_options;
  parse_options.allow_invalid_serial_numbers = true;

  // The objects returned by this function only last for the duration of a
  // single certificate verification, so there is no need to pool them to save
  // memory.
  //
  // TODO(eroman): Swallows the parsing errors. However uses a permissive
  // parsing model.
  CertErrors errors;
  return ParsedCertificate::Create(
      bssl::UniquePtr<CRYPTO_BUFFER>(CRYPTO_BUFFER_new(
          reinterpret_cast<const uint8_t *>(der.data()), der.size(), nullptr)),
      {}, &errors);
}